

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O0

bool __thiscall jbcoin::STAmount::isEquivalent(STAmount *this,STBase *t)

{
  bool local_39;
  STAmount *local_38;
  STAmount *v;
  STBase *t_local;
  STAmount *this_local;
  
  if (t == (STBase *)0x0) {
    local_38 = (STAmount *)0x0;
  }
  else {
    local_38 = (STAmount *)__dynamic_cast(t,&STBase::typeinfo,&typeinfo,0);
  }
  local_39 = false;
  if (local_38 != (STAmount *)0x0) {
    local_39 = jbcoin::operator==(local_38,this);
  }
  return local_39;
}

Assistant:

bool
STAmount::isEquivalent (const STBase& t) const
{
    const STAmount* v = dynamic_cast<const STAmount*> (&t);
    return v && (*v == *this);
}